

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall wasm::Literal::sqrtF32x4(Literal *__return_storage_ptr__,Literal *this)

{
  Type *this_00;
  long lVar1;
  Literal *this_01;
  double extraout_XMM0_Qa;
  double __x;
  double extraout_XMM0_Qa_00;
  undefined1 local_a0 [8];
  LaneArray<4> lanes;
  
  getLanesF32x4((LaneArray<4> *)local_a0,this);
  this_00 = &lanes._M_elems[3].type;
  __x = extraout_XMM0_Qa;
  for (lVar1 = 0; lVar1 != 0x60; lVar1 = lVar1 + 0x18) {
    this_01 = (Literal *)(local_a0 + lVar1);
    sqrt((Literal *)this_00,__x);
    if (this_01 != (Literal *)this_00) {
      ~Literal(this_01);
      Literal(this_01,(Literal *)this_00);
    }
    ~Literal((Literal *)this_00);
    __x = extraout_XMM0_Qa_00;
  }
  Literal(__return_storage_ptr__,(LaneArray<4> *)local_a0);
  std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)local_a0);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::sqrtF32x4() const {
  return unary<4, &Literal::getLanesF32x4, &Literal::sqrt>(*this);
}